

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlPointCoordCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinGlPointCoordCaseInstance *this)

{
  bool bVar1;
  uint width_00;
  uint height_00;
  deInt32 dVar2;
  deBool dVar3;
  deInt32 dVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  int iVar7;
  int x;
  int iVar8;
  VkPhysicalDeviceProperties *pVVar9;
  TestError *this_00;
  pointer pVVar10;
  float *pfVar11;
  reference dataPtr;
  TextureLevel *this_01;
  pointer pVVar12;
  TestContext *this_02;
  TestLog *log;
  float fVar13;
  float fVar14;
  float fVar15;
  allocator<char> local_211;
  string local_210;
  undefined4 local_1f0;
  allocator<char> local_1e9;
  string local_1e8;
  RGBA local_1c8;
  undefined1 local_1c4 [8];
  Vec4 color;
  float t;
  float s;
  float fragY;
  float fragX;
  int dy;
  int dx;
  int xo;
  int yo;
  int h;
  int w;
  int y1;
  int x1;
  int y0;
  int x0;
  float size;
  float centerY;
  float centerX;
  __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  local_168;
  __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  local_160;
  const_iterator pointIter;
  ConstPixelBufferAccess local_130;
  PixelBufferAccess local_108;
  Vec4 local_e0;
  __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  local_d0;
  __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  local_c8;
  iterator coord;
  int pointSizeDeltaMultiples;
  float maxPointSize;
  float minPointSize;
  VkPhysicalDeviceLimits *limits;
  undefined1 local_a0 [7];
  bool compareOk;
  Surface refImage;
  Surface resImage;
  Random rnd;
  allocator<tcu::Vector<float,_3>_> local_49;
  undefined1 local_48 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> coords;
  int numPoints;
  float threshold;
  int height;
  int width;
  UVec2 viewportSize;
  BuiltinGlPointCoordCaseInstance *this_local;
  
  viewportSize.m_data = (uint  [2])this;
  ShaderRenderCaseInstance::getViewportSize((ShaderRenderCaseInstance *)&height);
  width_00 = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)&height);
  height_00 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)&height);
  coords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3ca3d70a;
  coords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x10;
  std::allocator<tcu::Vector<float,_3>_>::allocator(&local_49);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_48,0x10
             ,&local_49);
  std::allocator<tcu::Vector<float,_3>_>::~allocator(&local_49);
  de::Random::Random((Random *)((long)&resImage.m_pixels.m_cap + 4),0x145fa);
  tcu::Surface::Surface((Surface *)&refImage.m_pixels.m_cap,width_00,height_00);
  tcu::Surface::Surface((Surface *)local_a0,width_00,height_00);
  pVVar9 = Context::getDeviceProperties
                     ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
  fVar13 = (pVVar9->limits).pointSizeRange[0];
  fVar14 = (pVVar9->limits).pointSizeRange[1];
  dVar2 = deCeilFloatToInt32((fVar14 - fVar13) / (pVVar9->limits).pointSizeGranularity);
  coord._M_current._4_4_ = de::max<int>(1,dVar2);
  while ((dVar3 = ::deGetFalse(), dVar3 == 0 && (fVar13 <= fVar14))) {
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      local_c8._M_current =
           (Vector<float,_3> *)
           std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::begin
                     ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                      local_48);
      while( true ) {
        local_d0._M_current =
             (Vector<float,_3> *)
             std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::end
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        local_48);
        bVar1 = __gnu_cxx::operator!=(&local_c8,&local_d0);
        if (!bVar1) break;
        fVar15 = de::Random::getFloat((Random *)((long)&resImage.m_pixels.m_cap + 4),-0.9,0.9);
        pVVar10 = __gnu_cxx::
                  __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                  ::operator->(&local_c8);
        pfVar11 = tcu::Vector<float,_3>::x(pVVar10);
        *pfVar11 = fVar15;
        fVar15 = de::Random::getFloat((Random *)((long)&resImage.m_pixels.m_cap + 4),-0.9,0.9);
        pVVar10 = __gnu_cxx::
                  __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                  ::operator->(&local_c8);
        pfVar11 = tcu::Vector<float,_3>::y(pVVar10);
        *pfVar11 = fVar15;
        iVar7 = de::Random::getInt((Random *)((long)&resImage.m_pixels.m_cap + 4),0,
                                   coord._M_current._4_4_);
        fVar15 = de::min<float>(fVar14,(float)iVar7 * (pVVar9->limits).pointSizeGranularity + fVar13
                               );
        pVVar10 = __gnu_cxx::
                  __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                  ::operator->(&local_c8);
        pfVar11 = tcu::Vector<float,_3>::z(pVVar10);
        *pfVar11 = fVar15;
        __gnu_cxx::
        __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
        ::operator++(&local_c8);
      }
      (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])();
      dataPtr = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
                           )local_48,0);
      ShaderRenderCaseInstance::addAttribute
                (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32_SFLOAT,0xc,0x10,dataPtr
                );
      ShaderRenderCaseInstance::getDefaultConstCoords();
      ShaderRenderCaseInstance::render
                (&this->super_ShaderRenderCaseInstance,0x10,0,(deUint16 *)0x0,
                 VK_PRIMITIVE_TOPOLOGY_POINT_LIST,&local_e0);
      tcu::Surface::getAccess(&local_108,(Surface *)&refImage.m_pixels.m_cap);
      this_01 = ShaderRenderCaseInstance::getResultImage(&this->super_ShaderRenderCaseInstance);
      tcu::TextureLevel::getAccess(&local_130,this_01);
      tcu::copy((EVP_PKEY_CTX *)&local_108,(EVP_PKEY_CTX *)&local_130);
      tcu::Surface::getAccess((PixelBufferAccess *)&pointIter,(Surface *)local_a0);
      tcu::clear((PixelBufferAccess *)&pointIter,
                 &(this->super_ShaderRenderCaseInstance).m_clearColor);
      local_168._M_current =
           (Vector<float,_3> *)
           std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::begin
                     ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                      local_48);
      __gnu_cxx::
      __normal_iterator<tcu::Vector<float,3>const*,std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>
      ::__normal_iterator<tcu::Vector<float,3>*>
                ((__normal_iterator<tcu::Vector<float,3>const*,std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>
                  *)&local_160,&local_168);
      while( true ) {
        _centerY = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::end
                             ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               *)local_48);
        bVar1 = __gnu_cxx::operator!=
                          (&local_160,
                           (__normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                            *)&centerY);
        if (!bVar1) break;
        pVVar12 = __gnu_cxx::
                  __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                  ::operator->(&local_160);
        fVar13 = tcu::Vector<float,_3>::x(pVVar12);
        fVar13 = (float)(int)width_00 * (fVar13 * 0.5 + 0.5);
        pVVar12 = __gnu_cxx::
                  __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                  ::operator->(&local_160);
        fVar14 = tcu::Vector<float,_3>::y(pVVar12);
        fVar14 = (float)(int)height_00 * (fVar14 * 0.5 + 0.5);
        pVVar12 = __gnu_cxx::
                  __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                  ::operator->(&local_160);
        fVar15 = tcu::Vector<float,_3>::z(pVVar12);
        dVar2 = deRoundFloatToInt32(fVar13 - fVar15 * 0.5);
        dVar4 = deRoundFloatToInt32(fVar14 + fVar15 * -0.5);
        dVar5 = deRoundFloatToInt32(fVar15 * 0.5 + fVar13);
        dVar6 = deRoundFloatToInt32(fVar15 * 0.5 + fVar14);
        for (dx = 0; dx < dVar6 - dVar4; dx = dx + 1) {
          for (dy = 0; dy < dVar5 - dVar2; dy = dy + 1) {
            iVar7 = dVar2 + dy;
            x = dVar4 + dx;
            color.m_data[3] = (((float)iVar7 + 0.5) - fVar13) / fVar15 + 0.5;
            color.m_data[2] = (((float)x + 0.5) - fVar14) / fVar15 + 0.5;
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)local_1c4,color.m_data[3],color.m_data[2],0.0,1.0);
            iVar8 = tcu::Surface::getWidth((Surface *)local_a0);
            bVar1 = de::inBounds<int>(iVar7,0,iVar8);
            if (bVar1) {
              iVar8 = tcu::Surface::getHeight((Surface *)local_a0);
              bVar1 = de::inBounds<int>(x,0,iVar8);
              if (bVar1) {
                tcu::RGBA::RGBA(&local_1c8,(Vec4 *)local_1c4);
                tcu::Surface::setPixel((Surface *)local_a0,iVar7,x,local_1c8);
              }
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
        ::operator++(&local_160);
      }
      this_02 = Context::getTestContext
                          ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
      log = tcu::TestContext::getLog(this_02);
      bVar1 = tcu::fuzzyCompare(log,"Result","Image comparison result",(Surface *)local_a0,
                                (Surface *)&refImage.m_pixels.m_cap,0.02,COMPARE_LOG_RESULT);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"Result image matches reference",&local_1e9);
        tcu::TestStatus::pass(__return_storage_ptr__,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,"Image mismatch",&local_211);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator(&local_211);
      }
      local_1f0 = 1;
      tcu::Surface::~Surface((Surface *)local_a0);
      tcu::Surface::~Surface((Surface *)&refImage.m_pixels.m_cap);
      de::Random::~Random((Random *)((long)&resImage.m_pixels.m_cap + 4));
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_48)
      ;
      return __return_storage_ptr__;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"minPointSize <= maxPointSize",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderBuiltinVarTests.cpp"
             ,0x212);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

TestStatus BuiltinGlPointCoordCaseInstance::iterate (void)
{
	const UVec2				viewportSize	= getViewportSize();
	const int				width			= viewportSize.x();
	const int				height			= viewportSize.y();
	const float				threshold		= 0.02f;
	const int				numPoints		= 16;
	vector<Vec3>			coords			(numPoints);
	de::Random				rnd				(0x145fa);
	Surface					resImage		(width, height);
	Surface					refImage		(width, height);
	bool					compareOk		= false;

	// Compute coordinates.
	{
		const VkPhysicalDeviceLimits&	limits					= m_context.getDeviceProperties().limits;
		const float						minPointSize			= limits.pointSizeRange[0];
		const float						maxPointSize			= limits.pointSizeRange[1];
		const int						pointSizeDeltaMultiples	= de::max(1, deCeilFloatToInt32((maxPointSize - minPointSize) / limits.pointSizeGranularity));

		TCU_CHECK(minPointSize <= maxPointSize);

		for (vector<Vec3>::iterator coord = coords.begin(); coord != coords.end(); ++coord)
		{
			coord->x() = rnd.getFloat(-0.9f, 0.9f);
			coord->y() = rnd.getFloat(-0.9f, 0.9f);
			coord->z() = de::min(maxPointSize, minPointSize + float(rnd.getInt(0, pointSizeDeltaMultiples)) * limits.pointSizeGranularity);
		}
	}

	setup();
	addAttribute(0u, VK_FORMAT_R32G32B32_SFLOAT, deUint32(sizeof(Vec3)), numPoints, &coords[0]);
	render(numPoints, 0, DE_NULL, VK_PRIMITIVE_TOPOLOGY_POINT_LIST);
	copy(resImage.getAccess(), getResultImage().getAccess());

	// Draw reference
	clear(refImage.getAccess(), m_clearColor);

	for (vector<Vec3>::const_iterator pointIter = coords.begin(); pointIter != coords.end(); ++pointIter)
	{
		const float	centerX	= float(width) *(pointIter->x()*0.5f + 0.5f);
		const float	centerY	= float(height)*(pointIter->y()*0.5f + 0.5f);
		const float	size	= pointIter->z();
		const int	x0		= deRoundFloatToInt32(centerX - size*0.5f);
		const int	y0		= deRoundFloatToInt32(centerY - size*0.5f);
		const int	x1		= deRoundFloatToInt32(centerX + size*0.5f);
		const int	y1		= deRoundFloatToInt32(centerY + size*0.5f);
		const int	w		= x1-x0;
		const int	h		= y1-y0;

		for (int yo = 0; yo < h; yo++)
		{
			for (int xo = 0; xo < w; xo++)
			{
				const int		dx		= x0+xo;
				const int		dy		= y0+yo;
				const float		fragX	= float(dx) + 0.5f;
				const float		fragY	= float(dy) + 0.5f;
				const float		s		= 0.5f + (fragX - centerX) / size;
				const float		t		= 0.5f + (fragY - centerY) / size;
				const Vec4		color	(s, t, 0.0f, 1.0f);

				if (de::inBounds(dx, 0, refImage.getWidth()) && de::inBounds(dy, 0, refImage.getHeight()))
					refImage.setPixel(dx, dy, RGBA(color));
			}
		}
	}

	compareOk = fuzzyCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", refImage, resImage, threshold, COMPARE_LOG_RESULT);

	if (compareOk)
		return TestStatus::pass("Result image matches reference");
	else
		return TestStatus::fail("Image mismatch");
}